

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

string * __thiscall
google::LogSink::ToString_abi_cxx11_
          (string *__return_storage_ptr__,LogSink *this,LogSeverity severity,char *file,int line,
          LogMessageTime *logmsgtime,char *message,size_t message_len)

{
  LogMessageTime *this_00;
  _Setfill<char> _Var1;
  _Setw _Var2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar6;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  undefined1 local_1b0 [8];
  ostringstream stream;
  char *message_local;
  LogMessageTime *logmsgtime_local;
  int line_local;
  char *file_local;
  LogSeverity severity_local;
  
  this_00 = (LogMessageTime *)CONCAT44(in_register_00000084,line);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
  std::ios::fill((char)local_1b0 + (char)*(_func_int **)((long)local_1b0 + -0x18));
  std::operator<<((ostream *)local_1b0,
                  **(char **)(LogSeverityNames + ((ulong)this & 0xffffffff) * 8));
  if ((fLB::FLAGS_log_year_in_prefix & 1) != 0) {
    _Var2 = std::setw(4);
    poVar4 = std::operator<<((ostream *)local_1b0,_Var2);
    iVar3 = LogMessageTime::year(this_00);
    std::ostream::operator<<(poVar4,iVar3 + 0x76c);
  }
  _Var2 = std::setw(2);
  poVar4 = std::operator<<((ostream *)local_1b0,_Var2);
  iVar3 = LogMessageTime::month(this_00);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3 + 1);
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  iVar3 = LogMessageTime::day(this_00);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,' ');
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  iVar3 = LogMessageTime::hour(this_00);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,':');
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  iVar3 = LogMessageTime::min(this_00);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,':');
  _Var2 = std::setw(2);
  poVar4 = std::operator<<(poVar4,_Var2);
  iVar3 = LogMessageTime::sec(this_00);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
  poVar4 = std::operator<<(poVar4,'.');
  _Var2 = std::setw(6);
  poVar4 = std::operator<<(poVar4,_Var2);
  lVar5 = LogMessageTime::usec(this_00);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,lVar5);
  poVar4 = std::operator<<(poVar4,' ');
  _Var1 = std::setfill<char>(' ');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  _Var2 = std::setw(5);
  poVar4 = std::operator<<(poVar4,_Var2);
  __id = std::this_thread::get_id();
  pbVar6 = std::operator<<(poVar4,__id);
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(pbVar6,_Var1._M_c);
  poVar4 = std::operator<<(poVar4,' ');
  poVar4 = std::operator<<(poVar4,(char *)CONCAT44(in_register_00000014,severity));
  poVar4 = std::operator<<(poVar4,':');
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)file);
  std::operator<<(poVar4,"] ");
  std::ostream::write(local_1b0,(long)logmsgtime);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
  return __return_storage_ptr__;
}

Assistant:

string LogSink::ToString(LogSeverity severity, const char* file, int line,
                         const LogMessageTime& logmsgtime, const char* message,
                         size_t message_len) {
  ostringstream stream;
  stream.fill('0');

  stream << LogSeverityNames[severity][0];
  if (FLAGS_log_year_in_prefix) {
    stream << setw(4) << 1900 + logmsgtime.year();
  }
  stream << setw(2) << 1 + logmsgtime.month() << setw(2) << logmsgtime.day()
         << ' ' << setw(2) << logmsgtime.hour() << ':' << setw(2)
         << logmsgtime.min() << ':' << setw(2) << logmsgtime.sec() << '.'
         << setw(6) << logmsgtime.usec() << ' ' << setfill(' ') << setw(5)
         << std::this_thread::get_id() << setfill('0') << ' ' << file << ':'
         << line << "] ";

  // A call to `write' is enclosed in parenthneses to prevent possible macro
  // expansion.  On Windows, `write' could be a macro defined for portability.
  (stream.write)(message, static_cast<std::streamsize>(message_len));
  return stream.str();
}